

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-socket.c
# Opt level: O1

char * address_port(lua_State *L,char *tmp,char *addr,int port_index,int *port)

{
  int iVar1;
  lua_Integer lVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  size_t __n;
  
  iVar1 = lua_type(L,port_index);
  if (iVar1 < 1) {
    pcVar3 = strchr(addr,0x5b);
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strchr(addr,0x3a);
      if (pcVar3 == (char *)0x0) {
        luaL_error(L,"Invalid address %s.",addr);
      }
      memcpy(tmp,addr,(long)pcVar3 - (long)addr);
      tmp[(long)pcVar3 - (long)addr] = '\0';
      uVar5 = strtoul(pcVar3 + 1,(char **)0x0,10);
      iVar1 = (int)uVar5;
      addr = tmp;
    }
    else {
      pcVar4 = strchr(addr,0x5d);
      if (pcVar4 == (char *)0x0) {
        luaL_error(L,"Invalid address %s.",addr);
      }
      __n = (long)pcVar4 - (long)(pcVar3 + 1);
      memcpy(tmp,pcVar3 + 1,__n);
      tmp[__n] = '\0';
      pcVar3 = strchr(pcVar4 + 1,0x3a);
      if (pcVar3 == (char *)0x0) {
        luaL_error(L,"Invalid address %s.",addr);
      }
      uVar5 = strtoul(pcVar3 + 1,(char **)0x0,10);
      iVar1 = (int)uVar5;
      addr = tmp;
    }
  }
  else {
    lVar2 = luaL_optinteger(L,port_index,0);
    iVar1 = (int)lVar2;
  }
  *port = iVar1;
  return addr;
}

Assistant:

static const char *
address_port(lua_State *L, char *tmp, const char * addr, int port_index, int *port) {
	const char * host;
	if (lua_isnoneornil(L,port_index)) {
		host = strchr(addr, '[');
		if (host) {
			// is ipv6
			++host;
			const char * sep = strchr(addr,']');
			if (sep == NULL) {
				luaL_error(L, "Invalid address %s.",addr);
			}
			memcpy(tmp, host, sep-host);
			tmp[sep-host] = '\0';
			host = tmp;
			sep = strchr(sep + 1, ':');
			if (sep == NULL) {
				luaL_error(L, "Invalid address %s.",addr);
			}
			*port = strtoul(sep+1,NULL,10);
		} else {
			// is ipv4
			const char * sep = strchr(addr,':');
			if (sep == NULL) {
				luaL_error(L, "Invalid address %s.",addr);
			}
			memcpy(tmp, addr, sep-addr);
			tmp[sep-addr] = '\0';
			host = tmp;
			*port = strtoul(sep+1,NULL,10);
		}
	} else {
		host = addr;
		*port = luaL_optinteger(L,port_index, 0);
	}
	return host;
}